

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_arena.h
# Opt level: O0

void * __thiscall
google::protobuf::internal::SerialArena::
AllocateAligned<(google::protobuf::internal::AllocationClient)0>(SerialArena *this,size_t n)

{
  bool bVar1;
  char **v1;
  char **v2;
  LogMessage *pLVar2;
  undefined1 auVar3 [16];
  SerialArena *local_90;
  void *ptr;
  undefined8 local_80;
  LogMessageFatal local_78 [23];
  Voidify local_61;
  char *local_60;
  string *local_58;
  string *absl_log_internal_check_op_result;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  LogMessageFatal local_38 [23];
  Voidify local_21;
  size_t local_20;
  size_t n_local;
  SerialArena *this_local;
  
  local_20 = n;
  n_local = (size_t)this;
  bVar1 = ArenaAlignDefault::IsAligned(n);
  absl_log_internal_check_op_result._7_1_ = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"internal::ArenaAlignDefault::IsAligned(n)");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
               ,0x75,local_48._M_len,local_48._M_str);
    absl_log_internal_check_op_result._7_1_ = 1;
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar2);
  }
  if ((absl_log_internal_check_op_result._7_1_ & 1) != 0) {
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<char*>(&this->limit_);
  local_60 = SerialArena::ptr(this);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<char*>(&local_60);
  local_58 = absl::lts_20240722::log_internal::Check_GEImpl<char*,char*>(v1,v2,"limit_ >= ptr()");
  if (local_58 == (string *)0x0) {
    bVar1 = MaybeAllocateAligned(this,local_20,&local_90);
    if (bVar1) {
      this_local = local_90;
    }
    else {
      this_local = (SerialArena *)AllocateAlignedFallback(this,local_20);
    }
    return this_local;
  }
  auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
  local_80 = auVar3._8_8_;
  ptr = auVar3._0_8_;
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/serial_arena.h"
             ,0x76,ptr,local_80);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_78);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_61,pLVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_78);
}

Assistant:

void* AllocateAligned(size_t n) {
    ABSL_DCHECK(internal::ArenaAlignDefault::IsAligned(n));
    ABSL_DCHECK_GE(limit_, ptr());

    if (alloc_client == AllocationClient::kArray) {
      if (void* res = TryAllocateFromCachedBlock(n)) {
        return res;
      }
    }

    void* ptr;
    if (PROTOBUF_PREDICT_TRUE(MaybeAllocateAligned(n, &ptr))) {
      return ptr;
    }
    return AllocateAlignedFallback(n);
  }